

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

monster_race * get_mon_num(wchar_t generated_level,wchar_t current_level)

{
  short sVar1;
  locality lVar2;
  topography tVar3;
  level_conflict *plVar4;
  char *pcVar5;
  alloc_entry *table;
  _Bool _Var6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  tm *ptVar11;
  monster_race *pmVar12;
  monster_race *pmVar13;
  monster_race *old;
  ulong uVar14;
  bitflag *flags;
  int *piVar15;
  long lVar16;
  long local_50;
  time_t local_38;
  
  table = alloc_race_table;
  if ((L'\0' < generated_level) && (uVar7 = Rand_div((uint)z_info->ood_monster_chance), uVar7 == 0))
  {
    uVar8 = ((uint)generated_level >> 2) + 2;
    if (z_info->ood_monster_amount <= uVar8) {
      uVar8 = (uint)z_info->ood_monster_amount;
    }
    generated_level = generated_level + uVar8;
  }
  if (alloc_race_size < 1) {
    local_50 = 0;
  }
  else {
    piVar15 = &table->prob3;
    lVar16 = 0;
    local_50 = 0;
    do {
      if (generated_level < piVar15[-3]) break;
      *piVar15 = 0;
      pmVar12 = r_info;
      if ((generated_level < L'\x01') || (L'\0' < piVar15[-3])) {
        uVar8 = ((alloc_entry *)(piVar15 + -4))->index;
        local_38 = time((time_t *)0x0);
        ptVar11 = localtime(&local_38);
        sVar1 = player->place;
        plVar4 = world->levels;
        flags = pmVar12[(int)uVar8].flags;
        _Var6 = flag_has_dbg(flags,0xc,0xf,"race->flags","RF_SEASONAL");
        if ((!_Var6) || ((ptVar11->tm_mon == 0xb && (ptVar11->tm_mday - 0x18U < 3)))) {
          _Var6 = flag_has_dbg(flags,0xc,1,"race->flags","RF_UNIQUE");
          if (((((!_Var6) || (pmVar12[(int)uVar8].cur_num < (int)(uint)pmVar12[(int)uVar8].max_num))
               && (((_Var6 = flag_has_dbg(flags,0xc,0xc,"race->flags","RF_FORCE_DEPTH"), !_Var6 ||
                    (pmVar12[(int)uVar8].level <= (int)player->depth)) &&
                   ((_Var6 = flag_has_dbg(flags,0xc,0x14,"race->flags","RF_ANGBAND"), !_Var6 ||
                    (plVar4[sVar1].locality == LOC_ANGBAND)))))) &&
              ((iVar9 = strcmp(world->name,"Angband Dungeon"), iVar9 == 0 ||
               ((((_Var6 = flag_has_dbg(flags,0xc,0x10,"race->flags","RF_AMON_RUDH"), !_Var6 ||
                  (plVar4[sVar1].locality == LOC_AMON_RUDH)) &&
                 (((_Var6 = flag_has_dbg(flags,0xc,0x11,"race->flags","RF_NARGOTHROND"), !_Var6 ||
                   (plVar4[sVar1].locality == LOC_NARGOTHROND)) &&
                  ((_Var6 = flag_has_dbg(flags,0xc,0x12,"race->flags","RF_DUNGORTHEB"), !_Var6 ||
                   (plVar4[sVar1].locality == LOC_NAN_DUNGORTHEB)))))) &&
                ((_Var6 = flag_has_dbg(flags,0xc,0x13,"race->flags","RF_GAURHOTH"), !_Var6 ||
                 (plVar4[sVar1].locality == LOC_TOL_IN_GAURHOTH)))))))) &&
             (((_Var6 = flag_has_dbg(flags,0xc,0x15,"race->flags","RF_DUNGEON"), !_Var6 ||
               (plVar4[sVar1].topography == TOP_CAVE)) &&
              ((_Var6 = flag_has_dbg(flags,0xc,0x22,"race->flags","RF_FLYING"), _Var6 ||
               (plVar4[sVar1].topography != TOP_MOUNTAINTOP)))))) {
            uVar10 = piVar15[-1];
            uVar14 = (ulong)uVar10;
            *piVar15 = uVar10;
            plVar4 = world->levels;
            sVar1 = player->place;
            lVar2 = plVar4[sVar1].locality;
            if (lVar2 == LOC_NAN_DUNGORTHEB) {
              pcVar5 = (pmVar12[(int)uVar8].base)->name;
              iVar9 = strcmp(pcVar5,"spider");
              if (iVar9 == 0) {
                uVar14 = (ulong)(uVar10 * 5);
              }
              else {
                iVar9 = strcmp(pcVar5,"person");
                if ((iVar9 == 0) || (iVar9 = strcmp(pcVar5,"humanoid"), iVar9 == 0)) {
                  uVar14 = (ulong)(uint)((int)uVar10 / 3);
                }
              }
            }
            else if (lVar2 == LOC_TOL_IN_GAURHOTH) {
              iVar9 = strcmp((pmVar12[(int)uVar8].base)->name,"wolf");
              if (iVar9 == 0) {
                uVar14 = (ulong)(uVar10 << 2);
              }
              else {
                _Var6 = flag_has_dbg(flags,0xc,0x49,"race->flags","RF_UNDEAD");
                uVar14 = (ulong)(uVar10 << _Var6);
              }
            }
            tVar3 = plVar4[sVar1].topography;
            uVar10 = (uint)uVar14;
            if (tVar3 == TOP_FOREST) {
              iVar9 = strcmp((pmVar12[(int)uVar8].base)->name,"reptile");
              if (iVar9 == 0) {
                uVar10 = (int)((int)(uVar14 >> 0x1f) + uVar10) >> 1;
              }
              else {
                _Var6 = flag_has_dbg(flags,0xc,0x47,"race->flags","RF_ANIMAL");
                if (_Var6) {
                  iVar9 = strcmp((pmVar12[(int)uVar8].base)->name,"zephyr hound");
                  uVar10 = uVar10 << (iVar9 != 0);
                }
              }
            }
            else if ((tVar3 == TOP_DESERT) || (tVar3 == TOP_MOUNTAIN)) {
              pcVar5 = (pmVar12[(int)uVar8].base)->name;
              iVar9 = strcmp(pcVar5,"reptile");
              if ((iVar9 == 0) ||
                 ((iVar9 = strcmp(pcVar5,"snake"), iVar9 == 0 ||
                  (iVar9 = strcmp(pcVar5,"centipede"), iVar9 == 0)))) {
                uVar10 = uVar10 * 2;
              }
              else {
                _Var6 = flag_has_dbg(flags,0xc,0x47,"race->flags","RF_ANIMAL");
                if (_Var6) {
                  uVar10 = (int)((int)(uVar14 >> 0x1f) + uVar10) >> 1;
                }
              }
            }
            *piVar15 = uVar10;
            local_50 = local_50 + (int)uVar10;
          }
        }
      }
      lVar16 = lVar16 + 1;
      piVar15 = piVar15 + 5;
    } while (lVar16 < alloc_race_size);
  }
  if (local_50 < 1) {
    pmVar12 = (monster_race *)0x0;
  }
  else {
    pmVar12 = get_mon_race_aux(local_50,table);
    uVar7 = Rand_div(100);
    if (((int)uVar7 < 0x3c) &&
       (pmVar13 = get_mon_race_aux(local_50,table), pmVar12->level <= pmVar13->level)) {
      pmVar12 = pmVar13;
    }
    if (((int)uVar7 < 10) &&
       (pmVar13 = get_mon_race_aux(local_50,table), pmVar12->level <= pmVar13->level)) {
      pmVar12 = pmVar13;
    }
  }
  return pmVar12;
}

Assistant:

struct monster_race *get_mon_num(int generated_level, int current_level)
{
	int i, p;
	long total;
	struct monster_race *race;
	alloc_entry *table = alloc_race_table;

	/* Occasionally produce a nastier monster in the dungeon */
	if (generated_level > 0 && one_in_(z_info->ood_monster_chance))
		generated_level += MIN(generated_level / 4 + 2,
			z_info->ood_monster_amount);

	total = 0L;

	/* Process probabilities */
	for (i = 0; i < alloc_race_size; i++) {
		/* Monsters are sorted by depth */
		if (table[i].level > generated_level) break;

		/* Default */
		table[i].prob3 = 0;

		/* No town monsters in dungeon */
		if (generated_level > 0 && table[i].level <= 0) continue;

		/* Get the chosen monster */
		race = &r_info[table[i].index];

		/* Some monsters will not be allowed on the current level */
		if (get_mon_forbidden(race)) continue;

		/* Accept */
		table[i].prob3 = table[i].prob2;

		/* Adjust for locality and topography */
		table[i].prob3 = get_mon_adjust(table[i].prob3, race);

		/* Total */
		total += table[i].prob3;
	}

	/* No legal monsters */
	if (total <= 0) return NULL;

	/* Pick a monster */
	race = get_mon_race_aux(total, table);

	/* Try for a "harder" monster once (50%) or twice (10%) */
	p = randint0(100);

	if (p < 60) {
		struct monster_race *old = race;

		/* Pick a new monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Try for a "harder" monster twice (10%) */
	if (p < 10) {
		struct monster_race *old = race;

		/* Pick a monster */
		race = get_mon_race_aux(total, table);

		/* Keep the deepest one */
		if (race->level < old->level) race = old;
	}

	/* Result */
	return race;
}